

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUser.cpp
# Opt level: O0

void __thiscall BaseUser::setPassword(BaseUser *this,string *_password)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  int local_1c;
  int i;
  string *_password_local;
  BaseUser *this_local;
  
  local_1c = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= (ulong)(long)local_1c) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)_password);
    this->password[local_1c] = *pcVar2;
    local_1c = local_1c + 1;
  }
  lVar3 = std::__cxx11::string::size();
  this->password[lVar3] = '\0';
  return;
}

Assistant:

void BaseUser::setPassword(const string &_password) {
    for (int i = 0; i < _password.size(); ++i) {
        password[i] = _password[i];
    }
    password[_password.size()] = '\0';
}